

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

exr_result_t exr_encoding_run(exr_const_context_t ctxt,int part_index,exr_encode_pipeline_t *encode)

{
  short sVar1;
  ushort uVar2;
  exr_coding_channel_info_t *peVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  exr_result_t eVar7;
  ulong uVar8;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  long lVar14;
  size_t newsz;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar7 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar7;
  }
  if (encode == (exr_encode_pipeline_t *)0x0) {
    eVar7 = (**(code **)(ctxt + 0x38))(ctxt,3);
    return eVar7;
  }
  if ((encode->context != ctxt) || (encode->part_index != part_index)) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar9 = "Invalid request for encoding update from different context / part";
LAB_00126482:
    eVar7 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar9);
    return eVar7;
  }
  uVar6 = *(uint *)(*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 4) &
          0xfffffffe;
  uVar8 = (ulong)uVar6;
  if ((uVar6 == 2) &&
     ((encode->sample_count_table == (int32_t *)0x0 ||
      (uVar8 = (ulong)(encode->chunk).width,
      encode->sample_count_alloc_size != (long)(encode->chunk).height * uVar8 * 4)))) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar9 = "Invalid / missing sample count table for deep data";
    goto LAB_00126482;
  }
  eVar7 = (exr_result_t)uVar8;
  bVar4 = 0 < encode->channel_count;
  if (encode->channel_count < 1) {
    newsz = 0;
  }
  else {
    lVar14 = 0;
    uVar10 = 0;
    newsz = 0;
    do {
      peVar3 = encode->channels;
      lVar11 = (long)*(int *)((long)&peVar3->height + lVar14);
      if (lVar11 == 0) {
        bVar5 = false;
      }
      else {
        lVar12 = (long)*(int *)((long)&peVar3->width + lVar14);
        if (lVar12 == 0) {
          pcVar9 = "Unexpected 0-width chunk to encode";
LAB_001263d5:
          uVar8 = (**(code **)(ctxt + 0x48))(ctxt,3,pcVar9);
        }
        else {
          if (*(long *)((long)&peVar3->field_12 + lVar14) == 0) {
            pcVar9 = "Missing channel data pointer - must encode all channels";
            goto LAB_001263d5;
          }
          sVar1 = *(short *)((long)&peVar3->user_bytes_per_element + lVar14);
          if ((sVar1 == 2) || (sVar1 == 4)) {
            uVar2 = *(ushort *)((long)&peVar3->user_data_type + lVar14);
            uVar6 = (uint)uVar2;
            if (uVar2 < 3) {
              newsz = newsz + (long)(&peVar3->bytes_per_element)[lVar14] * lVar12 * lVar11;
              bVar5 = false;
              goto LAB_00126416;
            }
            uVar13 = *(undefined8 *)((long)&peVar3->channel_name + lVar14);
            pcVar9 = "Invalid / unsupported output data type (%d) for channel %c (%s)";
          }
          else {
            uVar6 = (uint)sVar1;
            uVar13 = *(undefined8 *)((long)&peVar3->channel_name + lVar14);
            pcVar9 = "Invalid / unsupported output bytes per element (%d) for channel %c (%s)";
          }
          uVar8 = (**(code **)(ctxt + 0x48))(ctxt,3,pcVar9,uVar6,uVar10 & 0xffffffff,uVar13);
        }
        bVar5 = true;
      }
LAB_00126416:
      eVar7 = (exr_result_t)uVar8;
      if (bVar5) break;
      uVar10 = uVar10 + 1;
      lVar14 = lVar14 + 0x30;
      bVar4 = (long)uVar10 < (long)encode->channel_count;
    } while ((long)uVar10 < (long)encode->channel_count);
  }
  if (bVar4) {
    return eVar7;
  }
  encode->packed_bytes = 0;
  if (encode->convert_and_pack_fn == (_func_exr_result_t__exr_encode_pipeline_ptr *)0x0) {
    if ((encode->packed_buffer == (void *)0x0) || (newsz != encode->compressed_bytes)) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
      pcVar9 = 
      "Encode pipeline has no packing function declared and packed buffer is null or appears to need packing"
      ;
      goto LAB_00126482;
    }
  }
  else if (newsz != 0) {
    eVar7 = internal_encode_alloc_buffer
                      (encode,EXR_TRANSCODE_BUFFER_PACKED,&encode->packed_buffer,
                       &encode->packed_alloc_size,newsz);
    if (eVar7 == 0) {
      eVar7 = (*encode->convert_and_pack_fn)(encode);
    }
    goto LAB_00126519;
  }
  eVar7 = 0;
LAB_00126519:
  if (eVar7 == 0) {
    if ((encode->compress_fn == (_func_exr_result_t__exr_encode_pipeline_ptr *)0x0) ||
       (encode->packed_bytes == 0)) {
      internal_encode_free_buffer
                (encode,EXR_TRANSCODE_BUFFER_COMPRESSED,&encode->compressed_buffer,
                 &encode->compressed_alloc_size);
      internal_encode_free_buffer
                (encode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,&encode->packed_sample_count_table,
                 &encode->packed_sample_count_alloc_size);
      encode->compressed_buffer = encode->packed_buffer;
      encode->compressed_bytes = encode->packed_bytes;
      eVar7 = 0;
      encode->compressed_alloc_size = 0;
      encode->packed_sample_count_table = encode->sample_count_table;
      encode->packed_sample_count_alloc_size = 0;
      encode->packed_sample_count_bytes =
           (long)(encode->chunk).height * (long)(encode->chunk).width * 4;
    }
    else {
      eVar7 = (*encode->compress_fn)(encode);
    }
  }
  if (eVar7 == 0) {
    if (encode->yield_until_ready_fn == (_func_exr_result_t__exr_encode_pipeline_ptr *)0x0) {
      eVar7 = 0;
    }
    else {
      eVar7 = (*encode->yield_until_ready_fn)(encode);
    }
  }
  if (eVar7 == 0) {
    if (encode->write_fn != (_func_exr_result_t__exr_encode_pipeline_ptr *)0x0) {
      eVar7 = (*encode->write_fn)(encode);
      return eVar7;
    }
    eVar7 = 0;
  }
  return eVar7;
}

Assistant:

exr_result_t
exr_encoding_run (
    exr_const_context_t ctxt, int part_index, exr_encode_pipeline_t* encode)
{
    exr_result_t rv           = EXR_ERR_SUCCESS;
    uint64_t     packed_bytes = 0;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!encode)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));
    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for encoding update from different context / part"));

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (encode->sample_count_table == NULL ||
            encode->sample_count_alloc_size !=
                (((size_t) encode->chunk.width) *
                 ((size_t) encode->chunk.height) * sizeof (int32_t)))
        {
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / missing sample count table for deep data"));
        }
    }

    for (int c = 0; c < encode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* encc = (encode->channels + c);

        if (encc->height == 0) continue;

        if (encc->width == 0)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Unexpected 0-width chunk to encode"));
        if (!encc->encode_from_ptr)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Missing channel data pointer - must encode all channels"));

        /*
         * if a user specifies a bad pixel stride / line stride
         * we can't know this realistically, and they may want to
         * use 0 to cause things to collapse for testing purposes
         * so only test the values we can
         */
        if (encc->user_bytes_per_element != 2 &&
            encc->user_bytes_per_element != 4)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output bytes per element (%d) for channel %c (%s)",
                (int) encc->user_bytes_per_element,
                c,
                encc->channel_name));

        if (encc->user_data_type != (uint16_t) (EXR_PIXEL_HALF) &&
            encc->user_data_type != (uint16_t) (EXR_PIXEL_FLOAT) &&
            encc->user_data_type != (uint16_t) (EXR_PIXEL_UINT))
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output data type (%d) for channel %c (%s)",
                (int) encc->user_data_type,
                c,
                encc->channel_name));

        packed_bytes +=
            ((uint64_t) (encc->height) * (uint64_t) (encc->width) *
             (uint64_t) (encc->bytes_per_element));
    }

    encode->packed_bytes = 0;
    if (encode->convert_and_pack_fn)
    {
        if (packed_bytes > 0)
        {
            rv = internal_encode_alloc_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED,
                (void**) &(encode->packed_buffer),
                &(encode->packed_alloc_size),
                packed_bytes);

            if (rv == EXR_ERR_SUCCESS)
                rv = encode->convert_and_pack_fn (encode);
        }
    }
    else if (!encode->packed_buffer || packed_bytes != encode->compressed_bytes)
    {
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Encode pipeline has no packing function declared and packed buffer is null or appears to need packing"));
    }
    EXR_UNLOCK_WRITE (pctxt);

    if ((part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED) &&
        encode->sample_count_table != NULL)
    {
        priv_from_native32 (
            encode->sample_count_table,
            encode->chunk.width * encode->chunk.height);
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        if (encode->compress_fn && encode->packed_bytes > 0)
        {
            rv = encode->compress_fn (encode);
        }
        else
        {
            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_COMPRESSED,
                &(encode->compressed_buffer),
                &(encode->compressed_alloc_size));

            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size));

            encode->compressed_buffer     = encode->packed_buffer;
            encode->compressed_bytes      = encode->packed_bytes;
            encode->compressed_alloc_size = 0;

            encode->packed_sample_count_table      = encode->sample_count_table;
            encode->packed_sample_count_alloc_size = 0;
            encode->packed_sample_count_bytes =
                (((size_t) encode->chunk.width) *
                 ((size_t) encode->chunk.height) * sizeof (int32_t));
        }
    }

    if (rv == EXR_ERR_SUCCESS && encode->yield_until_ready_fn)
        rv = encode->yield_until_ready_fn (encode);

    if (rv == EXR_ERR_SUCCESS && encode->write_fn)
        rv = encode->write_fn (encode);

    if ((part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED) &&
        encode->sample_count_table != NULL)
    {
        priv_to_native32 (
            encode->sample_count_table,
            encode->chunk.width * encode->chunk.height);
    }

    return rv;
}